

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_0::SSBOLocalBarrierTest::initPrograms
          (SSBOLocalBarrierTest *this,SourceCollections *sourceCollections)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  ProgramSources *this_00;
  string local_220;
  ShaderSource local_200;
  allocator<char> local_1d1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream src;
  int numValues;
  int workGroupCount;
  int workGroupSize;
  SourceCollections *sourceCollections_local;
  SSBOLocalBarrierTest *this_local;
  
  iVar1 = compute::(anonymous_namespace)::multiplyComponents<int,3>(&this->m_localSize);
  iVar2 = compute::(anonymous_namespace)::multiplyComponents<int,3>(&this->m_workSize);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar4 = std::operator<<((ostream *)local_1a0,"#version 310 es\n");
  poVar4 = std::operator<<(poVar4,"layout (local_size_x = ");
  iVar3 = tcu::Vector<int,_3>::x(&this->m_localSize);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,", local_size_y = ");
  iVar3 = tcu::Vector<int,_3>::y(&this->m_localSize);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,", local_size_z = ");
  iVar3 = tcu::Vector<int,_3>::z(&this->m_localSize);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,") in;\n");
  poVar4 = std::operator<<(poVar4,"layout(binding = 0) coherent buffer Output {\n");
  poVar4 = std::operator<<(poVar4,"    uint values[");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1 * iVar2);
  poVar4 = std::operator<<(poVar4,"];\n");
  poVar4 = std::operator<<(poVar4,"} sb_out;\n\n");
  poVar4 = std::operator<<(poVar4,"void main (void) {\n");
  poVar4 = std::operator<<(poVar4,
                           "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar4 = std::operator<<(poVar4,
                           "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                          );
  poVar4 = std::operator<<(poVar4,"    uint globalOffs = localSize*globalNdx;\n");
  poVar4 = std::operator<<(poVar4,
                           "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
                          );
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"    sb_out.values[globalOffs + localOffs] = globalOffs;\n");
  poVar4 = std::operator<<(poVar4,"    memoryBarrierBuffer();\n");
  poVar4 = std::operator<<(poVar4,"    barrier();\n");
  poVar4 = std::operator<<(poVar4,
                           "    sb_out.values[globalOffs + ((localOffs+1u)%localSize)] += localOffs;\n"
                          );
  poVar4 = std::operator<<(poVar4,"    memoryBarrierBuffer();\n");
  poVar4 = std::operator<<(poVar4,"    barrier();\n");
  poVar4 = std::operator<<(poVar4,
                           "    sb_out.values[globalOffs + ((localOffs+2u)%localSize)] += localOffs;\n"
                          );
  std::operator<<(poVar4,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"comp",&local_1d1);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1d0);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_200,&local_220);
  glu::ProgramSources::operator<<(this_00,&local_200);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void SSBOLocalBarrierTest::initPrograms (SourceCollections& sourceCollections) const
{
	const int workGroupSize = multiplyComponents(m_localSize);
	const int workGroupCount = multiplyComponents(m_workSize);
	const int numValues = workGroupSize * workGroupCount;

	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
		<< "layout(binding = 0) coherent buffer Output {\n"
		<< "    uint values[" << numValues << "];\n"
		<< "} sb_out;\n\n"
		<< "void main (void) {\n"
		<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		<< "    uint globalOffs = localSize*globalNdx;\n"
		<< "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
		<< "\n"
		<< "    sb_out.values[globalOffs + localOffs] = globalOffs;\n"
		<< "    memoryBarrierBuffer();\n"
		<< "    barrier();\n"
		<< "    sb_out.values[globalOffs + ((localOffs+1u)%localSize)] += localOffs;\n"		// += so we read and write
		<< "    memoryBarrierBuffer();\n"
		<< "    barrier();\n"
		<< "    sb_out.values[globalOffs + ((localOffs+2u)%localSize)] += localOffs;\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}